

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::GlobalType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
          *values,GlobalType *out,char *desc)

{
  pointer pGVar1;
  Result RVar2;
  Enum EVar3;
  char *pcVar4;
  bool bVar5;
  int __c;
  Var *__s;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar2 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3),desc);
  Var::~Var(&local_78);
  if (out != (GlobalType *)0x0) {
    if (RVar2.enum_ == Ok) {
      pcVar4 = Var::index(var,(char *)__s,__c);
      pGVar1 = (values->
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar3 = pGVar1[(ulong)pcVar4 & 0xffffffff].type.enum_;
      bVar5 = pGVar1[(ulong)pcVar4 & 0xffffffff].mutable_;
    }
    else {
      EVar3 = Any;
      bVar5 = true;
    }
    (out->type).enum_ = EVar3;
    out->mutable_ = bVar5;
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}